

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrD
          (X3DImporter *this,int pAttrIdx,vector<double,_std::allocator<double>_> *pValue)

{
  pointer *ppdVar1;
  FIReader *pFVar2;
  pointer pdVar3;
  iterator __position;
  undefined *__accept;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  size_t sVar6;
  size_t sVar7;
  char *__nptr;
  char *__s_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  double local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  char *__s;
  
  pFVar2 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_40,pFVar2,pAttrIdx);
  if (local_40 == 0.0) {
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(local_40,&FIValue::typeinfo,&FIDoubleValue::typeinfo,0);
  }
  if (lVar5 == 0) {
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar5 = 0;
  }
  else {
    local_48 = local_38;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_38->_M_use_count = local_38->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_38->_M_use_count = local_38->_M_use_count + 1;
      }
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (lVar5 == 0) {
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar2,pAttrIdx);
    __s = (char *)CONCAT44(extraout_var,iVar4);
    pdVar3 = (pValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish != pdVar3) {
      (pValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar3;
    }
    sVar6 = strlen(__s);
    sVar7 = strspn(__s,WordIterator::whitespace);
    if (__s != (char *)0x0 && (long)sVar7 < (long)sVar6) {
      __nptr = __s + sVar7;
      do {
        local_40 = atof(__nptr);
        __position._M_current =
             (pValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (pValue,__position,&local_40);
        }
        else {
          *__position._M_current = local_40;
          ppdVar1 = &(pValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppdVar1 = *ppdVar1 + 1;
        }
        __accept = WordIterator::whitespace;
        sVar7 = strcspn(__nptr,WordIterator::whitespace);
        __s_00 = __nptr + sVar7;
        sVar7 = strspn(__s_00,__accept);
        __nptr = __s_00 + sVar7;
        if (__s + sVar6 <= __s_00 + sVar7) {
          __nptr = (char *)0x0;
        }
      } while (__nptr != (char *)0x0);
    }
  }
  else {
    std::vector<double,_std::allocator<double>_>::operator=
              (pValue,(vector<double,_std::allocator<double>_> *)(lVar5 + 8));
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrD(const int pAttrIdx, std::vector<double>& pValue)
{
    auto doubleValue = std::dynamic_pointer_cast<const FIDoubleValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (doubleValue) {
        pValue = doubleValue->value;
    }
    else {
        const char *val = mReader->getAttributeValue(pAttrIdx);
        pValue.clear();

        //std::cregex_iterator wordItBegin(val, val + strlen(val), pattern_nws);
        //const std::cregex_iterator wordItEnd;
        //std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const std::cmatch &match) { return std::stod(match.str()); });

        WordIterator wordItBegin(val, val + strlen(val));
        WordIterator wordItEnd;
        std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const char *match) { return atof(match); });
    }
}